

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_8_coeff_contexts_2d(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 *in_RCX;
  int in_ESI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i pos_to_offset [3];
  __m128i level [5];
  __m128i count;
  int col;
  int8_t *cc;
  int stride;
  undefined3 in_stack_fffffffffffffd68;
  undefined4 uVar1;
  undefined1 in_stack_fffffffffffffd6c;
  undefined1 in_stack_fffffffffffffd6d;
  undefined1 in_stack_fffffffffffffd6e;
  undefined1 in_stack_fffffffffffffd6f;
  undefined1 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd71;
  undefined1 in_stack_fffffffffffffd72;
  undefined1 in_stack_fffffffffffffd73;
  undefined1 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  uint8_t *src;
  undefined8 local_278;
  uint8_t *puStack_270;
  longlong local_258 [10];
  undefined8 local_208;
  undefined8 uStack_200;
  int local_1f4;
  undefined8 *local_1f0;
  undefined4 local_1e4;
  undefined8 *local_1e0;
  long local_1c8;
  undefined1 local_1b9;
  undefined1 local_1b8;
  undefined1 local_1b7;
  undefined1 local_1b6;
  undefined1 local_1b5;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined1 local_178;
  undefined1 local_177;
  undefined1 local_176;
  undefined1 local_175;
  undefined1 local_174;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 local_118;
  uint8_t *puStack_110;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined8 local_f8;
  uint8_t *puStack_f0;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  uint8_t *puStack_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  uint8_t *puStack_b0;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined8 local_98;
  uint8_t *puStack_90;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined8 local_78;
  uint8_t *puStack_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 local_58;
  uint8_t *puStack_50;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_1e4 = 0xc;
  if (in_ESI == 8) {
    local_159 = 0;
    local_15a = 1;
    local_15b = 6;
    local_15c = 6;
    local_15d = 0x15;
    local_15e = 0x15;
    local_15f = 0x15;
    local_160 = 0x15;
    local_161 = 1;
    local_162 = 6;
    local_163 = 6;
    local_164 = 0x15;
    local_165 = 0x15;
    local_166 = 0x15;
    local_167 = 0x15;
    local_168 = 0x15;
    in_stack_fffffffffffffd74 = 0x15;
    in_stack_fffffffffffffd75 = 0;
    local_f9 = 0x15;
    local_fa = 0x15;
    local_fb = 0x15;
    local_fc = 0x15;
    local_fd = 0x15;
    local_fe = 6;
    local_ff = 6;
    local_100 = 1;
    local_101 = 0x15;
    local_102 = 0x15;
    local_103 = 0x15;
    local_104 = 0x15;
    local_105 = 6;
    local_106 = 6;
    local_107 = 1;
    local_108 = 0;
    uVar2 = 0x1515151506060100;
    puVar4 = (uint8_t *)0x1515151515060601;
    local_169 = 6;
    local_16a = 6;
    local_16b = 0x15;
    local_16c = 0x15;
    local_16d = 0x15;
    local_16e = 0x15;
    local_16f = 0x15;
    local_170 = 0x15;
    local_171 = 6;
    local_172 = 0x15;
    local_173 = 0x15;
    local_174 = 0x15;
    local_175 = 0x15;
    local_176 = 0x15;
    local_177 = 0x15;
    local_178 = 0x15;
    in_stack_fffffffffffffd76 = 0x15;
    in_stack_fffffffffffffd77 = 6;
    local_d9 = 0x15;
    local_da = 0x15;
    local_db = 0x15;
    local_dc = 0x15;
    local_dd = 0x15;
    local_de = 0x15;
    local_df = 0x15;
    local_e0 = 6;
    local_e1 = 0x15;
    local_e2 = 0x15;
    local_e3 = 0x15;
    local_e4 = 0x15;
    local_e5 = 0x15;
    local_e6 = 0x15;
    local_e7 = 6;
    local_e8 = 6;
    local_278 = 0x1515151515150606;
    puStack_270 = (uint8_t *)0x1515151515151506;
    local_118 = uVar2;
    puStack_110 = puVar4;
    local_f8 = local_278;
    puStack_f0 = puStack_270;
  }
  else if (in_ESI < 8) {
    local_179 = 0;
    local_17a = 0xb;
    local_17b = 6;
    local_17c = 6;
    local_17d = 0x15;
    local_17e = 0x15;
    local_17f = 0x15;
    local_180 = 0x15;
    local_181 = 0xb;
    local_182 = 0xb;
    local_183 = 6;
    local_184 = 0x15;
    local_185 = 0x15;
    local_186 = 0x15;
    local_187 = 0x15;
    local_188 = 0x15;
    in_stack_fffffffffffffd70 = 0x15;
    in_stack_fffffffffffffd71 = 0;
    local_b9 = 0x15;
    local_ba = 0x15;
    local_bb = 0x15;
    local_bc = 0x15;
    local_bd = 0x15;
    local_be = 6;
    local_bf = 0xb;
    local_c0 = 0xb;
    local_c1 = 0x15;
    local_c2 = 0x15;
    local_c3 = 0x15;
    local_c4 = 0x15;
    local_c5 = 6;
    local_c6 = 6;
    local_c7 = 0xb;
    local_c8 = 0;
    uVar2 = 0x1515151506060b00;
    puVar4 = (uint8_t *)0x1515151515060b0b;
    local_189 = 0xb;
    local_18a = 0xb;
    local_18b = 0x15;
    local_18c = 0x15;
    local_18d = 0x15;
    local_18e = 0x15;
    local_18f = 0x15;
    local_190 = 0x15;
    local_191 = 0xb;
    local_192 = 0xb;
    local_193 = 0x15;
    local_194 = 0x15;
    local_195 = 0x15;
    local_196 = 0x15;
    local_197 = 0x15;
    local_198 = 0x15;
    in_stack_fffffffffffffd72 = 0x15;
    in_stack_fffffffffffffd73 = 0xb;
    local_99 = 0x15;
    local_9a = 0x15;
    local_9b = 0x15;
    local_9c = 0x15;
    local_9d = 0x15;
    local_9e = 0x15;
    local_9f = 0xb;
    local_a0 = 0xb;
    local_a1 = 0x15;
    local_a2 = 0x15;
    local_a3 = 0x15;
    local_a4 = 0x15;
    local_a5 = 0x15;
    local_a6 = 0x15;
    local_a7 = 0xb;
    local_a8 = 0xb;
    local_278 = 0x1515151515150b0b;
    puStack_270 = (uint8_t *)0x1515151515150b0b;
    local_d8 = uVar2;
    puStack_d0 = puVar4;
    local_b8 = local_278;
    puStack_b0 = puStack_270;
  }
  else {
    local_199 = 0;
    local_19a = 0x10;
    local_19b = 0x10;
    local_19c = 0x10;
    local_19d = 0x10;
    local_19e = 0x10;
    local_19f = 0x10;
    local_1a0 = 0x10;
    local_1a1 = 0x10;
    local_1a2 = 0x10;
    local_1a3 = 0x10;
    local_1a4 = 0x10;
    local_1a5 = 0x10;
    local_1a6 = 0x10;
    local_1a7 = 0x10;
    local_1a8 = 0x10;
    in_stack_fffffffffffffd6c = 0x10;
    in_stack_fffffffffffffd6d = 0;
    local_79 = 0x10;
    local_7a = 0x10;
    local_7b = 0x10;
    local_7c = 0x10;
    local_7d = 0x10;
    local_7e = 0x10;
    local_7f = 0x10;
    local_80 = 0x10;
    local_81 = 0x10;
    local_82 = 0x10;
    local_83 = 0x10;
    local_84 = 0x10;
    local_85 = 0x10;
    local_86 = 0x10;
    local_87 = 0x10;
    local_88 = 0;
    uVar2 = 0x1010101010101000;
    puVar4 = (uint8_t *)0x1010101010101010;
    local_1a9 = 6;
    local_1aa = 6;
    local_1ab = 0x15;
    local_1ac = 0x15;
    local_1ad = 0x15;
    local_1ae = 0x15;
    local_1af = 0x15;
    local_1b0 = 0x15;
    local_1b1 = 6;
    local_1b2 = 0x15;
    local_1b3 = 0x15;
    local_1b4 = 0x15;
    local_1b5 = 0x15;
    local_1b6 = 0x15;
    local_1b7 = 0x15;
    local_1b8 = 0x15;
    in_stack_fffffffffffffd6e = 0x15;
    in_stack_fffffffffffffd6f = 6;
    local_59 = 0x15;
    local_5a = 0x15;
    local_5b = 0x15;
    local_5c = 0x15;
    local_5d = 0x15;
    local_5e = 0x15;
    local_5f = 0x15;
    local_60 = 6;
    local_61 = 0x15;
    local_62 = 0x15;
    local_63 = 0x15;
    local_64 = 0x15;
    local_65 = 0x15;
    local_66 = 0x15;
    local_67 = 6;
    local_68 = 6;
    local_278 = 0x1515151515150606;
    puStack_270 = (uint8_t *)0x1515151515151506;
    local_98 = uVar2;
    puStack_90 = puVar4;
    local_78 = local_278;
    puStack_70 = puStack_270;
  }
  local_1b9 = 0x15;
  uVar1 = CONCAT13(0x15,in_stack_fffffffffffffd68);
  local_31 = 0x15;
  local_32 = 0x15;
  local_33 = 0x15;
  local_34 = 0x15;
  local_35 = 0x15;
  local_36 = 0x15;
  local_37 = 0x15;
  local_38 = 0x15;
  local_39 = 0x15;
  local_3a = 0x15;
  local_3b = 0x15;
  local_3c = 0x15;
  local_3d = 0x15;
  local_3e = 0x15;
  local_3f = 0x15;
  local_40 = 0x15;
  local_1f4 = in_ESI;
  local_1f0 = in_RCX;
  local_1e0 = in_RCX;
  local_1c8 = in_RDI;
  local_58 = 0x1515151515151515;
  puStack_50 = (uint8_t *)0x1515151515151515;
  do {
    src = puVar4;
    uVar3 = uVar2;
    load_levels_8x2x5_sse2
              (src,(int)((ulong)uVar3 >> 0x20),
               (ptrdiff_t *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,
                                 CONCAT15(in_stack_fffffffffffffd75,
                                          CONCAT14(in_stack_fffffffffffffd74,
                                                   CONCAT13(in_stack_fffffffffffffd73,
                                                            CONCAT12(in_stack_fffffffffffffd72,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
               (__m128i *)
               CONCAT17(in_stack_fffffffffffffd6f,
                        CONCAT16(in_stack_fffffffffffffd6e,
                                 CONCAT15(in_stack_fffffffffffffd6d,
                                          CONCAT14(in_stack_fffffffffffffd6c,uVar1)))));
    get_coeff_contexts_kernel_sse2((__m128i *)local_258);
    local_148 = (char)extraout_XMM0_Qa;
    cStack_147 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_146 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_145 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_144 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_143 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_142 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_141 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_140 = (char)extraout_XMM0_Qb;
    cStack_13f = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_13e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_13d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_13c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_13b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_13a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_139 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_158._0_1_ = (char)uVar3;
    local_158._1_1_ = (char)((ulong)uVar3 >> 8);
    local_158._2_1_ = (char)((ulong)uVar3 >> 0x10);
    local_158._3_1_ = (char)((ulong)uVar3 >> 0x18);
    local_158._4_1_ = (char)((ulong)uVar3 >> 0x20);
    local_158._5_1_ = (char)((ulong)uVar3 >> 0x28);
    local_158._6_1_ = (char)((ulong)uVar3 >> 0x30);
    local_158._7_1_ = (char)((ulong)uVar3 >> 0x38);
    uStack_150._0_1_ = (char)src;
    uStack_150._1_1_ = (char)((ulong)src >> 8);
    uStack_150._2_1_ = (char)((ulong)src >> 0x10);
    uStack_150._3_1_ = (char)((ulong)src >> 0x18);
    uStack_150._4_1_ = (char)((ulong)src >> 0x20);
    uStack_150._5_1_ = (char)((ulong)src >> 0x28);
    uStack_150._6_1_ = (char)((ulong)src >> 0x30);
    uStack_150._7_1_ = (char)((ulong)src >> 0x38);
    local_208 = CONCAT17(cStack_141 + local_158._7_1_,
                         CONCAT16(cStack_142 + local_158._6_1_,
                                  CONCAT15(cStack_143 + local_158._5_1_,
                                           CONCAT14(cStack_144 + local_158._4_1_,
                                                    CONCAT13(cStack_145 + local_158._3_1_,
                                                             CONCAT12(cStack_146 + local_158._2_1_,
                                                                      CONCAT11(cStack_147 +
                                                                               local_158._1_1_,
                                                                               local_148 +
                                                                               (char)local_158))))))
                        );
    uStack_200 = CONCAT17(cStack_139 + uStack_150._7_1_,
                          CONCAT16(cStack_13a + uStack_150._6_1_,
                                   CONCAT15(cStack_13b + uStack_150._5_1_,
                                            CONCAT14(cStack_13c + uStack_150._4_1_,
                                                     CONCAT13(cStack_13d + uStack_150._3_1_,
                                                              CONCAT12(cStack_13e + uStack_150._2_1_
                                                                       ,CONCAT11(cStack_13f +
                                                                                 uStack_150._1_1_,
                                                                                 cStack_140 +
                                                                                 (char)uStack_150)))
                                                    ))));
    local_120 = local_1f0;
    local_138 = local_208;
    uStack_130 = uStack_200;
    *local_1f0 = local_208;
    local_1f0[1] = uStack_200;
    local_1c8 = local_1c8 + 0x18;
    local_1f0 = local_1f0 + 2;
    local_1f4 = local_1f4 + -2;
    uVar2 = local_278;
    puVar4 = puStack_270;
    local_278 = 0x1515151515151515;
    puStack_270 = (uint8_t *)0x1515151515151515;
    local_158 = uVar3;
    uStack_150 = src;
  } while (local_1f4 != 0);
  *(undefined1 *)local_1e0 = 0;
  return;
}

Assistant:

static inline void get_8_coeff_contexts_2d(const uint8_t *levels,
                                           const int width,
                                           const ptrdiff_t *const offsets,
                                           int8_t *coeff_contexts) {
  const int stride = 8 + TX_PAD_HOR;
  int8_t *cc = coeff_contexts;
  int col = width;
  __m128i count;
  __m128i level[5];
  __m128i pos_to_offset[3];

  assert(!(width % 2));

  if (width == 8) {
    pos_to_offset[0] =
        _mm_setr_epi8(0, 1, 6, 6, 21, 21, 21, 21, 1, 6, 6, 21, 21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 6, 21, 21,
                                     21, 21, 21, 21, 21);
  } else if (width < 8) {
    pos_to_offset[0] = _mm_setr_epi8(0, 11, 6, 6, 21, 21, 21, 21, 11, 11, 6, 21,
                                     21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(11, 11, 21, 21, 21, 21, 21, 21, 11, 11, 21,
                                     21, 21, 21, 21, 21);
  } else {
    pos_to_offset[0] = _mm_setr_epi8(0, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
                                     16, 16, 16, 16, 16);
    pos_to_offset[1] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 6, 21, 21,
                                     21, 21, 21, 21, 21);
  }
  pos_to_offset[2] = _mm_set1_epi8(21);

  do {
    load_levels_8x2x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset[0]);
    _mm_store_si128((__m128i *)cc, count);
    pos_to_offset[0] = pos_to_offset[1];
    pos_to_offset[1] = pos_to_offset[2];
    levels += 2 * stride;
    cc += 16;
    col -= 2;
  } while (col);

  coeff_contexts[0] = 0;
}